

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# analyzer.cpp
# Opt level: O0

void __thiscall SQCompilation::VarScope::merge(VarScope *this,VarScope *other)

{
  SymbolInfo *pSVar1;
  bool bVar2;
  pointer ppVar3;
  pointer pvVar4;
  mapped_type *ppVVar5;
  int *piVar6;
  int *in_RSI;
  int *in_RDI;
  iterator f;
  iterator te;
  const_iterator ie;
  const_iterator it;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *otherSymbols;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *thisSymbols;
  VarScope *r;
  VarScope *l;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_stack_ffffffffffffff78;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *in_stack_ffffffffffffff80;
  ValueRef *in_stack_ffffffffffffff88;
  ValueRef *this_00;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_50;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_48;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_40;
  _Node_iterator_base<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_true> local_38;
  int *local_30;
  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
  *local_28;
  int *local_20;
  int *local_18;
  int *local_10;
  
  local_20 = in_RSI;
  local_10 = in_RSI;
  for (local_18 = in_RDI; local_18 != (int *)0x0; local_18 = *(int **)(local_18 + 4)) {
    local_28 = (unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                *)(local_18 + 6);
    local_30 = local_20 + 6;
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::begin(in_stack_ffffffffffffff78);
    local_40._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::end(in_stack_ffffffffffffff78);
    local_48._M_cur =
         (__node_type *)
         std::
         unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
         ::end(in_stack_ffffffffffffff78);
    while (bVar2 = std::__detail::operator!=(&local_38,&local_40), bVar2) {
      std::__detail::
      _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
      operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                  *)0x1864c1);
      local_50._M_cur =
           (__node_type *)
           std::
           unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
           ::find(in_stack_ffffffffffffff78,(key_type *)0x1864ce);
      bVar2 = std::__detail::operator!=(&local_50,&local_48);
      if (bVar2) {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                               *)0x1864f2);
        pSVar1 = pvVar4->second->info;
        ppVar3 = std::__detail::
                 _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                 ::operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                               *)0x186508);
        if (pSVar1 == ppVar3->second->info) {
          ppVar3 = std::__detail::
                   _Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                   ::operator->((_Node_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                                 *)0x186523);
          this_00 = ppVar3->second;
          std::__detail::
          _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
          ::operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                        *)0x186536);
          ValueRef::merge(this_00,in_stack_ffffffffffffff88);
        }
      }
      else {
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                               *)0x186550);
        ValueRef::kill(pvVar4->second,5,1);
        pvVar4 = std::__detail::
                 _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                 ::operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                               *)0x18656d);
        in_stack_ffffffffffffff88 = pvVar4->second;
        in_stack_ffffffffffffff80 = local_28;
        std::__detail::
        _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
        operator->((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                    *)0x18658a);
        ppVVar5 = std::
                  unordered_map<const_char_*,_SQCompilation::ValueRef_*,_SQCompilation::StringHasher,_SQCompilation::StringEqualer,_std::allocator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>_>_>
                  ::operator[](in_stack_ffffffffffffff80,(key_type *)in_stack_ffffffffffffff78);
        *ppVVar5 = in_stack_ffffffffffffff88;
      }
      std::__detail::
      _Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>::
      operator++((_Node_const_iterator<std::pair<const_char_*const,_SQCompilation::ValueRef_*>,_false,_true>
                  *)in_stack_ffffffffffffff80);
    }
    local_20 = *(int **)(local_20 + 4);
  }
  piVar6 = std::max<int>(in_RDI,local_10);
  *in_RDI = *piVar6 + 1;
  return;
}

Assistant:

void VarScope::merge(const VarScope *other) {
  VarScope *l = this;
  const VarScope *r = other;

  while (l) {
    assert(l->depth == r->depth && "Scope corruption");
    assert(l->owner == r->owner && "Scope corruption");

    auto &thisSymbols = l->symbols;
    auto &otherSymbols = r->symbols;
    auto it = otherSymbols.begin();
    auto ie = otherSymbols.end();
    auto te = thisSymbols.end();

    while (it != ie) {
      auto f = thisSymbols.find(it->first);
      if (f != te) {
        if (it->second->info == f->second->info) // lambdas declared on the same line could have same names
          f->second->merge(it->second);
      }
      else {
        it->second->kill(VRS_PARTIALLY);
        thisSymbols[it->first] = it->second;
      }
      ++it;
    }

    l = l->parent;
    r = r->parent;
  }

  evalId = std::max(evalId, other->evalId) + 1;
}